

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::GenerateInstallRules(cmLocalGenerator *this)

{
  string *config_00;
  cmMakefile *pcVar1;
  __type _Var2;
  bool bVar3;
  char *pcVar4;
  reference pbVar5;
  ulong uVar6;
  reference pvVar7;
  cmState *this_00;
  ostream *poVar8;
  void *pvVar9;
  reference ppcVar10;
  pointer pSVar11;
  byte local_599;
  allocator local_551;
  Directory local_550;
  undefined1 local_528 [8];
  string odir;
  string local_500;
  Directory local_4e0;
  __normal_iterator<cmState::Snapshot_*,_std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>_>
  local_4b8;
  __normal_iterator<cmState::Snapshot_*,_std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>_>
  local_4b0;
  __normal_iterator<const_cmState::Snapshot_*,_std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>_>
  local_4a8;
  const_iterator ci;
  undefined1 local_488 [8];
  vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> children;
  __normal_iterator<cmInstallGenerator_*const_*,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
  local_468;
  const_iterator gi;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *installers;
  string local_450;
  char *local_430;
  char *so_no_exe;
  undefined1 local_400 [8];
  cmGeneratedFileStream fout;
  int toplevel_install;
  string homedir;
  Directory local_188;
  undefined1 local_160 [8];
  string file;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118;
  iterator i;
  char **c;
  char *default_order [5];
  string default_config;
  string *config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  string local_78;
  char *local_58;
  char *stagingPrefix;
  allocator local_39;
  string local_38;
  char *local_18;
  char *prefix;
  cmLocalGenerator *this_local;
  
  pcVar1 = this->Makefile;
  prefix = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CMAKE_INSTALL_PREFIX",&local_39);
  pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pcVar4;
  if (pcVar4 == (char *)0x0) {
    local_18 = "/usr/local";
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_78,"CMAKE_STAGING_PREFIX",
             (allocator *)
             ((long)&configurationTypes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&configurationTypes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  if (pcVar4 != (char *)0x0) {
    local_18 = pcVar4;
  }
  local_58 = pcVar4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&config);
  cmMakefile::GetConfigurations
            ((string *)((long)&default_config.field_2 + 8),this->Makefile,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&config,false);
  config_00 = (string *)(default_config.field_2._M_local_buf + 8);
  std::__cxx11::string::string((string *)(default_order + 4),(string *)config_00);
  memcpy(&c,&PTR_anon_var_dwarf_2a35bc_00c40990,0x28);
  i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c;
  while( true ) {
    local_599 = 0;
    if (*(long *)i._M_current != 0) {
      local_599 = std::__cxx11::string::empty();
    }
    if ((local_599 & 1) == 0) break;
    local_118._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&config);
    while( true ) {
      local_120._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&config);
      bVar3 = __gnu_cxx::operator!=(&local_118,&local_120);
      if (!bVar3) break;
      pbVar5 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_118);
      cmsys::SystemTools::UpperCase((string *)((long)&file.field_2 + 8),pbVar5);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&file.field_2 + 8),*(char **)i._M_current);
      std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
      if (bVar3) {
        pbVar5 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_118);
        std::__cxx11::string::operator=((string *)(default_order + 4),(string *)pbVar5);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_118);
    }
    i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(i._M_current)->_M_string_length;
  }
  uVar6 = std::__cxx11::string::empty();
  if (((uVar6 & 1) != 0) &&
     (bVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&config), !bVar3)) {
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&config,0);
    std::__cxx11::string::operator=((string *)(default_order + 4),(string *)pvVar7);
  }
  cmState::Snapshot::GetDirectory(&local_188,&this->StateSnapshot);
  pcVar4 = cmState::Directory::GetCurrentBinary(&local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_160,pcVar4,(allocator *)(homedir.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(homedir.field_2._M_local_buf + 0xf));
  this_00 = GetState(this);
  pcVar4 = cmState::GetBinaryDirectory(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&toplevel_install,pcVar4,(allocator *)&fout.field_0x247);
  std::allocator<char>::~allocator((allocator<char> *)&fout.field_0x247);
  fout._576_4_ = 0;
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_160,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &toplevel_install);
  if (_Var2) {
    fout._576_4_ = 1;
  }
  std::__cxx11::string::operator+=((string *)local_160,"/cmake_install.cmake");
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_400,pcVar4,false);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_400,true);
  poVar8 = std::operator<<((ostream *)local_400,"# Install script for directory: ");
  cmState::Snapshot::GetDirectory((Directory *)&so_no_exe,&this->StateSnapshot);
  pcVar4 = cmState::Directory::GetCurrentSource((Directory *)&so_no_exe);
  poVar8 = std::operator<<(poVar8,pcVar4);
  pvVar9 = (void *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)local_400,"# Set the install prefix");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<(poVar8,"if(NOT DEFINED CMAKE_INSTALL_PREFIX)");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<(poVar8,"  set(CMAKE_INSTALL_PREFIX \"");
  poVar8 = std::operator<<(poVar8,local_18);
  poVar8 = std::operator<<(poVar8,"\")");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<(poVar8,"endif()");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<(poVar8,"string(REGEX REPLACE \"/$\" \"\" CMAKE_INSTALL_PREFIX ");
  poVar8 = std::operator<<(poVar8,"\"${CMAKE_INSTALL_PREFIX}\")");
  pvVar9 = (void *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)local_400,
                           "# Set the install configuration name.\nif(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n  if(BUILD_TYPE)\n    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n  else()\n    set(CMAKE_INSTALL_CONFIG_NAME \""
                          );
  poVar8 = std::operator<<(poVar8,(string *)(default_order + 4));
  std::operator<<(poVar8,
                  "\")\n  endif()\n  message(STATUS \"Install configuration: \\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\nendif()\n\n"
                 );
  std::operator<<((ostream *)local_400,
                  "# Set the component getting installed.\nif(NOT CMAKE_INSTALL_COMPONENT)\n  if(COMPONENT)\n    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n  else()\n    set(CMAKE_INSTALL_COMPONENT)\n  endif()\nendif()\n\n"
                 );
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_450,"CMAKE_INSTALL_SO_NO_EXE",(allocator *)((long)&installers + 7));
  pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator((allocator<char> *)((long)&installers + 7));
  local_430 = pcVar4;
  if (pcVar4 != (char *)0x0) {
    poVar8 = std::operator<<((ostream *)local_400,
                             "# Install shared libraries without execute permission?\nif(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n  set(CMAKE_INSTALL_SO_NO_EXE \""
                            );
    poVar8 = std::operator<<(poVar8,local_430);
    std::operator<<(poVar8,"\")\nendif()\n\n");
  }
  gi._M_current = (cmInstallGenerator **)cmMakefile::GetInstallGenerators(this->Makefile);
  local_468._M_current =
       (cmInstallGenerator **)
       std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::begin
                 ((vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *)
                  gi._M_current);
  while( true ) {
    children.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::end
                            ((vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *)
                             gi._M_current);
    bVar3 = __gnu_cxx::operator!=
                      (&local_468,
                       (__normal_iterator<cmInstallGenerator_*const_*,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
                        *)&children.
                           super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar3) break;
    ppcVar10 = __gnu_cxx::
               __normal_iterator<cmInstallGenerator_*const_*,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
               ::operator*(&local_468);
    cmScriptGenerator::Generate
              (&(*ppcVar10)->super_cmScriptGenerator,(ostream *)local_400,config_00,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&config);
    __gnu_cxx::
    __normal_iterator<cmInstallGenerator_*const_*,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
    ::operator++(&local_468);
  }
  GenerateTargetInstallRules
            (this,(ostream *)local_400,config_00,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&config);
  cmMakefile::GetStateSnapshot((Snapshot *)&ci,this->Makefile);
  cmState::Snapshot::GetChildren
            ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_488,
             (Snapshot *)&ci);
  bVar3 = std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::empty
                    ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_488);
  if (!bVar3) {
    std::operator<<((ostream *)local_400,"if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n");
    std::operator<<((ostream *)local_400,"  # Include the install script for each subdirectory.\n");
    local_4b0._M_current =
         (Snapshot *)
         std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::begin
                   ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_488);
    __gnu_cxx::
    __normal_iterator<cmState::Snapshot_const*,std::vector<cmState::Snapshot,std::allocator<cmState::Snapshot>>>
    ::__normal_iterator<cmState::Snapshot*>
              ((__normal_iterator<cmState::Snapshot_const*,std::vector<cmState::Snapshot,std::allocator<cmState::Snapshot>>>
                *)&local_4a8,&local_4b0);
    while( true ) {
      local_4b8._M_current =
           (Snapshot *)
           std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::end
                     ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_488);
      bVar3 = __gnu_cxx::operator!=(&local_4a8,&local_4b8);
      if (!bVar3) break;
      pSVar11 = __gnu_cxx::
                __normal_iterator<const_cmState::Snapshot_*,_std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>_>
                ::operator->(&local_4a8);
      cmState::Snapshot::GetDirectory(&local_4e0,pSVar11);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_500,"EXCLUDE_FROM_ALL",
                 (allocator *)(odir.field_2._M_local_buf + 0xf));
      bVar3 = cmState::Directory::GetPropertyAsBool(&local_4e0,&local_500);
      std::__cxx11::string::~string((string *)&local_500);
      std::allocator<char>::~allocator((allocator<char> *)(odir.field_2._M_local_buf + 0xf));
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        pSVar11 = __gnu_cxx::
                  __normal_iterator<const_cmState::Snapshot_*,_std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>_>
                  ::operator->(&local_4a8);
        cmState::Snapshot::GetDirectory(&local_550,pSVar11);
        pcVar4 = cmState::Directory::GetCurrentBinary(&local_550);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_528,pcVar4,&local_551);
        std::allocator<char>::~allocator((allocator<char> *)&local_551);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_528);
        poVar8 = std::operator<<((ostream *)local_400,"  include(\"");
        poVar8 = std::operator<<(poVar8,(string *)local_528);
        poVar8 = std::operator<<(poVar8,"/cmake_install.cmake\")");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_528);
      }
      __gnu_cxx::
      __normal_iterator<const_cmState::Snapshot_*,_std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>_>
      ::operator++(&local_4a8);
    }
    std::operator<<((ostream *)local_400,"\n");
    std::operator<<((ostream *)local_400,"endif()\n\n");
  }
  if (fout._576_4_ != 0) {
    poVar8 = std::operator<<((ostream *)local_400,
                             "if(CMAKE_INSTALL_COMPONENT)\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest_${CMAKE_INSTALL_COMPONENT}.txt\")\nelse()\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\nendif()\n\nstring(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\nfile(WRITE \""
                            );
    poVar8 = std::operator<<(poVar8,(string *)&toplevel_install);
    std::operator<<(poVar8,
                    "/${CMAKE_INSTALL_MANIFEST}\"\n     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n");
  }
  std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::~vector
            ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_488);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_400);
  std::__cxx11::string::~string((string *)&toplevel_install);
  std::__cxx11::string::~string((string *)local_160);
  std::__cxx11::string::~string((string *)(default_order + 4));
  std::__cxx11::string::~string((string *)(default_config.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&config);
  return;
}

Assistant:

void cmLocalGenerator::GenerateInstallRules()
{
  // Compute the install prefix.
  const char* prefix = this->Makefile->GetDefinition("CMAKE_INSTALL_PREFIX");
#if defined(_WIN32) && !defined(__CYGWIN__)
  std::string prefix_win32;
  if(!prefix)
    {
    if(!cmSystemTools::GetEnv("SystemDrive", prefix_win32))
      {
      prefix_win32 = "C:";
      }
    const char* project_name = this->Makefile->GetDefinition("PROJECT_NAME");
    if(project_name && project_name[0])
      {
      prefix_win32 += "/Program Files/";
      prefix_win32 += project_name;
      }
    else
      {
      prefix_win32 += "/InstalledCMakeProject";
      }
    prefix = prefix_win32.c_str();
    }
#elif defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (!prefix)
    {
    if (find_directory(B_SYSTEM_DIRECTORY, -1, false, dir, sizeof(dir))
        == B_OK)
      {
      prefix = dir;
      }
    else
      {
      prefix = "/boot/system";
      }
    }
#else
  if (!prefix)
    {
    prefix = "/usr/local";
    }
#endif
  if (const char *stagingPrefix
                  = this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX"))
    {
    prefix = stagingPrefix;
    }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes;
  const std::string& config =
    this->Makefile->GetConfigurations(configurationTypes, false);

  // Choose a default install configuration.
  std::string default_config = config;
  const char* default_order[] = {"RELEASE", "MINSIZEREL",
                                 "RELWITHDEBINFO", "DEBUG", 0};
  for(const char** c = default_order; *c && default_config.empty(); ++c)
    {
    for(std::vector<std::string>::iterator i = configurationTypes.begin();
        i != configurationTypes.end(); ++i)
      {
      if(cmSystemTools::UpperCase(*i) == *c)
        {
        default_config = *i;
        }
      }
    }
  if(default_config.empty() && !configurationTypes.empty())
    {
    default_config = configurationTypes[0];
    }

  // Create the install script file.
  std::string file =
      this->StateSnapshot.GetDirectory().GetCurrentBinary();
  std::string homedir = this->GetState()->GetBinaryDirectory();
  int toplevel_install = 0;
  if (file == homedir)
    {
    toplevel_install = 1;
    }
  file += "/cmake_install.cmake";
  cmGeneratedFileStream fout(file.c_str());
  fout.SetCopyIfDifferent(true);

  // Write the header.
  fout << "# Install script for directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource()
       << std::endl << std::endl;
  fout << "# Set the install prefix" << std::endl
       << "if(NOT DEFINED CMAKE_INSTALL_PREFIX)" << std::endl
       << "  set(CMAKE_INSTALL_PREFIX \"" << prefix << "\")" << std::endl
       << "endif()" << std::endl
       << "string(REGEX REPLACE \"/$\" \"\" CMAKE_INSTALL_PREFIX "
       << "\"${CMAKE_INSTALL_PREFIX}\")" << std::endl
       << std::endl;

  // Write support code for generating per-configuration install rules.
  fout <<
    "# Set the install configuration name.\n"
    "if(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n"
    "  if(BUILD_TYPE)\n"
    "    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n"
    "           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_CONFIG_NAME \"" << default_config << "\")\n"
    "  endif()\n"
    "  message(STATUS \"Install configuration: "
    "\\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\n"
    "endif()\n"
    "\n";

  // Write support code for dealing with component-specific installs.
  fout <<
    "# Set the component getting installed.\n"
    "if(NOT CMAKE_INSTALL_COMPONENT)\n"
    "  if(COMPONENT)\n"
    "    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n"
    "    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_COMPONENT)\n"
    "  endif()\n"
    "endif()\n"
    "\n";

  // Copy user-specified install options to the install code.
  if(const char* so_no_exe =
     this->Makefile->GetDefinition("CMAKE_INSTALL_SO_NO_EXE"))
    {
    fout <<
      "# Install shared libraries without execute permission?\n"
      "if(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n"
      "  set(CMAKE_INSTALL_SO_NO_EXE \"" << so_no_exe << "\")\n"
      "endif()\n"
      "\n";
    }

  // Ask each install generator to write its code.
  std::vector<cmInstallGenerator*> const& installers =
    this->Makefile->GetInstallGenerators();
  for(std::vector<cmInstallGenerator*>::const_iterator
        gi = installers.begin();
      gi != installers.end(); ++gi)
    {
    (*gi)->Generate(fout, config, configurationTypes);
    }

  // Write rules from old-style specification stored in targets.
  this->GenerateTargetInstallRules(fout, config, configurationTypes);

  // Include install scripts from subdirectories.
  std::vector<cmState::Snapshot> children
      = this->Makefile->GetStateSnapshot().GetChildren();
  if(!children.empty())
    {
    fout << "if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n";
    fout << "  # Include the install script for each subdirectory.\n";
    for(std::vector<cmState::Snapshot>::const_iterator
          ci = children.begin(); ci != children.end(); ++ci)
      {
      if(!ci->GetDirectory().GetPropertyAsBool("EXCLUDE_FROM_ALL"))
        {
        std::string odir = ci->GetDirectory().GetCurrentBinary();
        cmSystemTools::ConvertToUnixSlashes(odir);
        fout << "  include(\"" <<  odir
             << "/cmake_install.cmake\")" << std::endl;
        }
      }
    fout << "\n";
    fout << "endif()\n\n";
    }

  // Record the install manifest.
  if ( toplevel_install )
    {
    fout <<
      "if(CMAKE_INSTALL_COMPONENT)\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest_"
      "${CMAKE_INSTALL_COMPONENT}.txt\")\n"
      "else()\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\n"
      "endif()\n"
      "\n"
      "string(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n"
      "       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\n"
      "file(WRITE \"" << homedir << "/${CMAKE_INSTALL_MANIFEST}\"\n"
      "     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n";
    }
}